

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsscenebsptreeindex.cpp
# Opt level: O3

void QGraphicsSceneBspTreeIndexPrivate::sortItems
               (QList<QGraphicsItem_*> *itemList,SortOrder order,bool sortCacheEnabled,
               bool onlyTopLevelItems)

{
  qreal *pqVar1;
  long lVar2;
  double dVar3;
  QGraphicsItem *pQVar4;
  QGraphicsItemPrivate *pQVar5;
  bool bVar6;
  iterator iVar7;
  iterator iVar8;
  ulong uVar9;
  QGraphicsItem **ppQVar10;
  QGraphicsItem **ppQVar11;
  iterator iVar12;
  QGraphicsItem *pQVar13;
  QGraphicsItem **ppQVar14;
  iterator iVar15;
  iterator __i;
  QGraphicsItem **ppQVar16;
  uint uVar17;
  int iVar18;
  long lVar19;
  QGraphicsItemPrivate *pQVar20;
  long lVar21;
  value_type __val_14;
  size_t sVar22;
  value_type __val_12;
  value_type __val;
  bool bVar23;
  
  if (order != ~AscendingOrder) {
    if (onlyTopLevelItems) {
      if (order == AscendingOrder) {
        iVar7 = QList<QGraphicsItem_*>::begin(itemList);
        iVar8 = QList<QGraphicsItem_*>::end(itemList);
        if (iVar7.i != iVar8.i) {
          uVar9 = (long)iVar8.i - (long)iVar7.i >> 3;
          lVar19 = 0x3f;
          if (uVar9 != 0) {
            for (; uVar9 >> lVar19 == 0; lVar19 = lVar19 + -1) {
            }
          }
          std::
          __introsort_loop<QList<QGraphicsItem*>::iterator,long_long,__gnu_cxx::__ops::_Iter_comp_iter<bool(*)(QGraphicsItem_const*,QGraphicsItem_const*)>>
                    (iVar7,iVar8,(ulong)(((uint)lVar19 ^ 0x3f) * 2) ^ 0x7e,
                     (_Iter_comp_iter<bool_(*)(const_QGraphicsItem_*,_const_QGraphicsItem_*)>)
                     0x5ed4cc);
          ppQVar16 = iVar7.i + 1;
          iVar12 = iVar7;
          if (0x80 < (long)iVar8.i - (long)iVar7.i) {
            sVar22 = 8;
            do {
              ppQVar14 = iVar7.i + sVar22;
              pQVar4 = *(QGraphicsItem **)((long)iVar7.i + sVar22);
              pQVar5 = ((*iVar7.i)->d_ptr).d;
              pQVar20 = (pQVar4->d_ptr).d;
              uVar9 = *(ulong *)&pQVar20->field_0x160 & 0x10000000000;
              uVar17 = (uint)(uVar9 >> 0x28);
              if (((uint)((ulong)*(undefined8 *)&pQVar5->field_0x160 >> 0x28) & 1) == uVar17) {
                dVar3 = pQVar5->z;
                pqVar1 = &pQVar20->z;
                if ((dVar3 == *pqVar1) && (!NAN(dVar3) && !NAN(*pqVar1))) {
                  if (pQVar20->siblingIndex < pQVar5->siblingIndex) goto LAB_006244bb;
                  goto LAB_0062441a;
                }
                if (dVar3 < *pqVar1 || dVar3 == *pqVar1) goto LAB_0062441a;
LAB_006244bb:
                memmove(ppQVar16,iVar7.i,sVar22);
                iVar15 = iVar7;
              }
              else {
                if (uVar9 != 0) goto LAB_006244bb;
LAB_0062441a:
                pQVar13 = *iVar12.i;
                pQVar5 = (pQVar13->d_ptr).d;
                iVar15.i = ppQVar14;
                if (((uint)((ulong)*(undefined8 *)&pQVar5->field_0x160 >> 0x28) & 1) == uVar17) {
                  dVar3 = pQVar5->z;
                  pqVar1 = &pQVar20->z;
                  bVar6 = dVar3 == *pqVar1;
                  bVar23 = dVar3 < *pqVar1;
                  if (!bVar6) goto LAB_0062444f;
                  if (NAN(dVar3) || NAN(*pqVar1)) goto LAB_0062444f;
                  if (pQVar20->siblingIndex < pQVar5->siblingIndex) {
LAB_00624451:
                    do {
                      while( true ) {
                        while( true ) {
                          iVar15.i = iVar12.i;
                          iVar15.i[1] = pQVar13;
                          iVar12.i = iVar15.i + -1;
                          pQVar13 = iVar15.i[-1];
                          pQVar5 = (pQVar13->d_ptr).d;
                          pQVar20 = (pQVar4->d_ptr).d;
                          uVar9 = *(ulong *)&pQVar20->field_0x160 & 0x10000000000;
                          if (((uint)((ulong)*(undefined8 *)&pQVar5->field_0x160 >> 0x28) & 1) ==
                              (uint)(uVar9 >> 0x28)) break;
                          if (uVar9 == 0) goto LAB_006244cc;
                        }
                        dVar3 = pQVar5->z;
                        pqVar1 = &pQVar20->z;
                        bVar6 = dVar3 == *pqVar1;
                        bVar23 = dVar3 < *pqVar1;
                        if ((!bVar6) || (NAN(dVar3) || NAN(*pqVar1))) break;
                        if (pQVar5->siblingIndex <= pQVar20->siblingIndex) goto LAB_006244cc;
                      }
LAB_0062444f:
                    } while (!bVar23 && !bVar6);
                  }
                }
                else if (uVar9 != 0) goto LAB_00624451;
              }
LAB_006244cc:
              *iVar15.i = pQVar4;
              sVar22 = sVar22 + 8;
              iVar12.i = ppQVar14;
            } while (sVar22 != 0x80);
            ppQVar16 = iVar7.i + 0x10;
LAB_00624bb8:
            if (ppQVar16 == iVar8.i) {
              return;
            }
            pQVar13 = ppQVar16[-1];
            pQVar4 = *ppQVar16;
            pQVar5 = (pQVar13->d_ptr).d;
            pQVar20 = (pQVar4->d_ptr).d;
            uVar9 = *(ulong *)&pQVar20->field_0x160 & 0x10000000000;
            ppQVar14 = ppQVar16;
            if (((uint)((ulong)*(undefined8 *)&pQVar5->field_0x160 >> 0x28) & 1) ==
                (uint)(uVar9 >> 0x28)) {
              dVar3 = pQVar5->z;
              pqVar1 = &pQVar20->z;
              if ((dVar3 != *pqVar1) || (NAN(dVar3) || NAN(*pqVar1))) {
                if (*pqVar1 <= dVar3 && dVar3 != *pqVar1) goto LAB_00624c2b;
              }
              else if (pQVar20->siblingIndex < pQVar5->siblingIndex) {
LAB_00624c2b:
                do {
                  *ppQVar14 = pQVar13;
                  pQVar13 = ppQVar14[-2];
                  pQVar5 = (pQVar13->d_ptr).d;
                  pQVar20 = (pQVar4->d_ptr).d;
                  uVar9 = *(ulong *)&pQVar20->field_0x160 & 0x10000000000;
                  if (((uint)((ulong)*(undefined8 *)&pQVar5->field_0x160 >> 0x28) & 1) ==
                      (uint)(uVar9 >> 0x28)) {
                    dVar3 = pQVar5->z;
                    pqVar1 = &pQVar20->z;
                    if ((dVar3 != *pqVar1) || (NAN(dVar3) || NAN(*pqVar1))) {
                      if (dVar3 < *pqVar1 || dVar3 == *pqVar1) goto LAB_00624c8c;
                    }
                    else if (pQVar5->siblingIndex <= pQVar20->siblingIndex) goto LAB_00624c8c;
                  }
                  else if (uVar9 == 0) goto LAB_00624c8c;
                  ppQVar14 = ppQVar14 + -1;
                } while( true );
              }
            }
            else if (uVar9 != 0) goto LAB_00624c2b;
            goto LAB_00624c90;
          }
          for (; ppQVar16 != iVar8.i; ppQVar16 = ppQVar16 + 1) {
            pQVar4 = *ppQVar16;
            pQVar5 = ((*iVar7.i)->d_ptr).d;
            pQVar20 = (pQVar4->d_ptr).d;
            uVar9 = *(ulong *)&pQVar20->field_0x160 & 0x10000000000;
            uVar17 = (uint)(uVar9 >> 0x28);
            if (((uint)((ulong)*(undefined8 *)&pQVar5->field_0x160 >> 0x28) & 1) == uVar17) {
              dVar3 = pQVar5->z;
              pqVar1 = &pQVar20->z;
              if ((dVar3 == *pqVar1) && (!NAN(dVar3) && !NAN(*pqVar1))) {
                if (pQVar20->siblingIndex < pQVar5->siblingIndex) goto LAB_00624abc;
                goto LAB_00624a82;
              }
              if (dVar3 < *pqVar1 || dVar3 == *pqVar1) goto LAB_00624a82;
LAB_00624abc:
              lVar19 = (long)ppQVar16 - (long)iVar7.i >> 3;
              iVar15 = iVar7;
              if (0 < lVar19) {
                lVar21 = 1;
                do {
                  iVar12.i[lVar21] = iVar12.i[lVar21 + -1];
                  lVar2 = lVar19 + lVar21;
                  lVar21 = lVar21 + -1;
                } while (1 < lVar2 - 1U);
              }
            }
            else {
              if (uVar9 != 0) goto LAB_00624abc;
LAB_00624a82:
              pQVar13 = *iVar12.i;
              pQVar5 = (pQVar13->d_ptr).d;
              ppQVar14 = iVar12.i;
              ppQVar10 = ppQVar16;
              if (((uint)((ulong)*(undefined8 *)&pQVar5->field_0x160 >> 0x28) & 1) != uVar17)
              goto joined_r0x00624afe;
              dVar3 = pQVar5->z;
              pqVar1 = &pQVar20->z;
              iVar15.i = ppQVar16;
              ppQVar10 = iVar12.i;
              if ((dVar3 != *pqVar1) || (NAN(dVar3) || NAN(*pqVar1))) {
                if (*pqVar1 <= dVar3 && dVar3 != *pqVar1) goto LAB_00624b30;
              }
              else if (pQVar20->siblingIndex < pQVar5->siblingIndex) {
LAB_00624b30:
                do {
                  while( true ) {
                    ppQVar10[1] = pQVar13;
                    ppQVar14 = ppQVar10 + -1;
                    pQVar13 = ppQVar10[-1];
                    pQVar5 = (pQVar13->d_ptr).d;
                    pQVar20 = (pQVar4->d_ptr).d;
                    uVar9 = *(ulong *)&pQVar20->field_0x160 & 0x10000000000;
                    if (((uint)((ulong)*(undefined8 *)&pQVar5->field_0x160 >> 0x28) & 1) !=
                        (uint)(uVar9 >> 0x28)) break;
                    dVar3 = pQVar5->z;
                    pqVar1 = &pQVar20->z;
                    iVar15.i = ppQVar10;
                    ppQVar10 = ppQVar14;
                    if ((dVar3 != *pqVar1) || (NAN(dVar3) || NAN(*pqVar1))) {
                      if (dVar3 < *pqVar1 || dVar3 == *pqVar1) goto LAB_00624b97;
                    }
                    else if (pQVar5->siblingIndex <= pQVar20->siblingIndex) goto LAB_00624b97;
                  }
joined_r0x00624afe:
                  iVar15.i = ppQVar10;
                  ppQVar10 = ppQVar14;
                } while (uVar9 != 0);
              }
            }
LAB_00624b97:
            *iVar15.i = pQVar4;
            iVar12.i = iVar12.i + 1;
          }
        }
      }
      else if (order == DescendingOrder) {
        iVar7 = QList<QGraphicsItem_*>::begin(itemList);
        iVar8 = QList<QGraphicsItem_*>::end(itemList);
        if (iVar7.i != iVar8.i) {
          uVar9 = (long)iVar8.i - (long)iVar7.i >> 3;
          lVar19 = 0x3f;
          if (uVar9 != 0) {
            for (; uVar9 >> lVar19 == 0; lVar19 = lVar19 + -1) {
            }
          }
          std::
          __introsort_loop<QList<QGraphicsItem*>::iterator,long_long,__gnu_cxx::__ops::_Iter_comp_iter<bool(*)(QGraphicsItem_const*,QGraphicsItem_const*)>>
                    (iVar7,iVar8,(ulong)(((uint)lVar19 ^ 0x3f) * 2) ^ 0x7e,
                     (_Iter_comp_iter<bool_(*)(const_QGraphicsItem_*,_const_QGraphicsItem_*)>)
                     0x62558a);
          ppQVar16 = iVar7.i + 1;
          iVar12 = iVar7;
          if (0x80 < (long)iVar8.i - (long)iVar7.i) {
            sVar22 = 8;
            do {
              ppQVar14 = iVar7.i + sVar22;
              pQVar4 = *(QGraphicsItem **)((long)iVar7.i + sVar22);
              pQVar5 = (pQVar4->d_ptr).d;
              pQVar20 = ((*iVar7.i)->d_ptr).d;
              uVar9 = *(ulong *)&pQVar20->field_0x160 & 0x10000000000;
              uVar17 = (uint)((ulong)*(undefined8 *)&pQVar5->field_0x160 >> 0x28) & 1;
              if (uVar17 == (uint)(uVar9 >> 0x28)) {
                dVar3 = pQVar5->z;
                pqVar1 = &pQVar20->z;
                if ((dVar3 == *pqVar1) && (!NAN(dVar3) && !NAN(*pqVar1))) {
                  if (pQVar20->siblingIndex < pQVar5->siblingIndex) goto LAB_006240c1;
                  goto LAB_0062408c;
                }
                if (dVar3 < *pqVar1 || dVar3 == *pqVar1) goto LAB_0062408c;
LAB_006240c1:
                memmove(ppQVar16,iVar7.i,sVar22);
                iVar15 = iVar7;
              }
              else {
                if (uVar9 != 0) goto LAB_006240c1;
LAB_0062408c:
                pQVar13 = *iVar12.i;
                pQVar20 = (pQVar13->d_ptr).d;
                uVar9 = *(ulong *)&pQVar20->field_0x160 & 0x10000000000;
                iVar15.i = ppQVar14;
                if (uVar17 != (uint)(uVar9 >> 0x28)) goto LAB_0062416c;
                dVar3 = pQVar5->z;
                pqVar1 = &pQVar20->z;
                bVar6 = dVar3 == *pqVar1;
                bVar23 = dVar3 < *pqVar1;
                if ((bVar6) && (!NAN(dVar3) && !NAN(*pqVar1))) {
                  iVar18 = pQVar5->siblingIndex;
                  goto LAB_00624162;
                }
                while (ppQVar10 = iVar12.i, !bVar23 && !bVar6) {
                  while( true ) {
                    while( true ) {
                      ppQVar10[1] = pQVar13;
                      iVar12.i = ppQVar10 + -1;
                      pQVar13 = ppQVar10[-1];
                      pQVar5 = (pQVar4->d_ptr).d;
                      pQVar20 = (pQVar13->d_ptr).d;
                      uVar9 = *(ulong *)&pQVar20->field_0x160 & 0x10000000000;
                      iVar15.i = ppQVar10;
                      if (((uint)((ulong)*(undefined8 *)&pQVar5->field_0x160 >> 0x28) & 1) ==
                          (uint)(uVar9 >> 0x28)) break;
LAB_0062416c:
                      ppQVar10 = iVar12.i;
                      if (uVar9 == 0) goto LAB_006240f9;
                    }
                    dVar3 = pQVar5->z;
                    pqVar1 = &pQVar20->z;
                    bVar6 = dVar3 == *pqVar1;
                    bVar23 = dVar3 < *pqVar1;
                    if ((!bVar6) || (NAN(dVar3) || NAN(*pqVar1))) break;
                    iVar18 = pQVar5->siblingIndex;
LAB_00624162:
                    ppQVar10 = iVar12.i;
                    if (iVar18 <= pQVar20->siblingIndex) goto LAB_006240f9;
                  }
                }
              }
LAB_006240f9:
              *iVar15.i = pQVar4;
              sVar22 = sVar22 + 8;
              iVar12.i = ppQVar14;
            } while (sVar22 != 0x80);
            ppQVar16 = iVar7.i + 0x10;
LAB_00624940:
            if (ppQVar16 == iVar8.i) {
              return;
            }
            pQVar13 = ppQVar16[-1];
            pQVar4 = *ppQVar16;
            pQVar5 = (pQVar4->d_ptr).d;
            pQVar20 = (pQVar13->d_ptr).d;
            uVar9 = *(ulong *)&pQVar20->field_0x160 & 0x10000000000;
            ppQVar14 = ppQVar16;
            if (((uint)((ulong)*(undefined8 *)&pQVar5->field_0x160 >> 0x28) & 1) ==
                (uint)(uVar9 >> 0x28)) {
              dVar3 = pQVar5->z;
              pqVar1 = &pQVar20->z;
              if ((dVar3 != *pqVar1) || (NAN(dVar3) || NAN(*pqVar1))) {
                if (*pqVar1 <= dVar3 && dVar3 != *pqVar1) goto LAB_006249b3;
              }
              else if (pQVar20->siblingIndex < pQVar5->siblingIndex) {
LAB_006249b3:
                do {
                  *ppQVar14 = pQVar13;
                  pQVar13 = ppQVar14[-2];
                  pQVar5 = (pQVar4->d_ptr).d;
                  pQVar20 = (pQVar13->d_ptr).d;
                  uVar9 = *(ulong *)&pQVar20->field_0x160 & 0x10000000000;
                  if (((uint)((ulong)*(undefined8 *)&pQVar5->field_0x160 >> 0x28) & 1) ==
                      (uint)(uVar9 >> 0x28)) {
                    dVar3 = pQVar5->z;
                    pqVar1 = &pQVar20->z;
                    if ((dVar3 != *pqVar1) || (NAN(dVar3) || NAN(*pqVar1))) {
                      if (dVar3 < *pqVar1 || dVar3 == *pqVar1) goto LAB_00624a14;
                    }
                    else if (pQVar5->siblingIndex <= pQVar20->siblingIndex) goto LAB_00624a14;
                  }
                  else if (uVar9 == 0) goto LAB_00624a14;
                  ppQVar14 = ppQVar14 + -1;
                } while( true );
              }
            }
            else if (uVar9 != 0) goto LAB_006249b3;
            goto LAB_00624a18;
          }
          for (; ppQVar16 != iVar8.i; ppQVar16 = ppQVar16 + 1) {
            pQVar4 = *ppQVar16;
            pQVar5 = (pQVar4->d_ptr).d;
            pQVar20 = ((*iVar7.i)->d_ptr).d;
            uVar9 = *(ulong *)&pQVar20->field_0x160 & 0x10000000000;
            uVar17 = (uint)((ulong)*(undefined8 *)&pQVar5->field_0x160 >> 0x28) & 1;
            if (uVar17 == (uint)(uVar9 >> 0x28)) {
              dVar3 = pQVar5->z;
              pqVar1 = &pQVar20->z;
              if ((dVar3 == *pqVar1) && (!NAN(dVar3) && !NAN(*pqVar1))) {
                if (pQVar20->siblingIndex < pQVar5->siblingIndex) goto LAB_00624843;
                goto LAB_00624808;
              }
              if (dVar3 < *pqVar1 || dVar3 == *pqVar1) goto LAB_00624808;
LAB_00624843:
              lVar19 = (long)ppQVar16 - (long)iVar7.i >> 3;
              iVar15 = iVar7;
              if (0 < lVar19) {
                lVar21 = 1;
                do {
                  iVar12.i[lVar21] = iVar12.i[lVar21 + -1];
                  lVar2 = lVar19 + lVar21;
                  lVar21 = lVar21 + -1;
                } while (1 < lVar2 - 1U);
              }
            }
            else {
              if (uVar9 != 0) goto LAB_00624843;
LAB_00624808:
              pQVar13 = *iVar12.i;
              pQVar20 = (pQVar13->d_ptr).d;
              uVar9 = *(ulong *)&pQVar20->field_0x160 & 0x10000000000;
              ppQVar14 = iVar12.i;
              ppQVar10 = ppQVar16;
              if (uVar17 != (uint)(uVar9 >> 0x28)) goto joined_r0x00624885;
              dVar3 = pQVar5->z;
              pqVar1 = &pQVar20->z;
              iVar15.i = ppQVar16;
              ppQVar10 = iVar12.i;
              if ((dVar3 != *pqVar1) || (NAN(dVar3) || NAN(*pqVar1))) {
                if (*pqVar1 <= dVar3 && dVar3 != *pqVar1) goto LAB_006248b8;
              }
              else if (pQVar20->siblingIndex < pQVar5->siblingIndex) {
LAB_006248b8:
                do {
                  while( true ) {
                    ppQVar10[1] = pQVar13;
                    ppQVar14 = ppQVar10 + -1;
                    pQVar13 = ppQVar10[-1];
                    pQVar5 = (pQVar4->d_ptr).d;
                    pQVar20 = (pQVar13->d_ptr).d;
                    uVar9 = *(ulong *)&pQVar20->field_0x160 & 0x10000000000;
                    if (((uint)((ulong)*(undefined8 *)&pQVar5->field_0x160 >> 0x28) & 1) !=
                        (uint)(uVar9 >> 0x28)) break;
                    dVar3 = pQVar5->z;
                    pqVar1 = &pQVar20->z;
                    iVar15.i = ppQVar10;
                    ppQVar10 = ppQVar14;
                    if ((dVar3 != *pqVar1) || (NAN(dVar3) || NAN(*pqVar1))) {
                      if (dVar3 < *pqVar1 || dVar3 == *pqVar1) goto LAB_0062491f;
                    }
                    else if (pQVar5->siblingIndex <= pQVar20->siblingIndex) goto LAB_0062491f;
                  }
joined_r0x00624885:
                  iVar15.i = ppQVar10;
                  ppQVar10 = ppQVar14;
                } while (uVar9 != 0);
              }
            }
LAB_0062491f:
            *iVar15.i = pQVar4;
            iVar12.i = iVar12.i + 1;
          }
        }
      }
    }
    else if (sortCacheEnabled) {
      if (order == AscendingOrder) {
        iVar7 = QList<QGraphicsItem_*>::begin(itemList);
        iVar8 = QList<QGraphicsItem_*>::end(itemList);
        if (iVar7.i != iVar8.i) {
          uVar9 = (long)iVar8.i - (long)iVar7.i >> 3;
          lVar19 = 0x3f;
          if (uVar9 != 0) {
            for (; uVar9 >> lVar19 == 0; lVar19 = lVar19 + -1) {
            }
          }
          std::
          __introsort_loop<QList<QGraphicsItem*>::iterator,long_long,__gnu_cxx::__ops::_Iter_comp_iter<bool(*)(QGraphicsItem_const*,QGraphicsItem_const*)>>
                    (iVar7,iVar8,(ulong)(((uint)lVar19 ^ 0x3f) * 2) ^ 0x7e,
                     (_Iter_comp_iter<bool_(*)(const_QGraphicsItem_*,_const_QGraphicsItem_*)>)
                     0x625606);
          ppQVar16 = iVar7.i + 1;
          iVar12 = iVar7;
          if ((long)iVar8.i - (long)iVar7.i < 0x81) {
            for (; ppQVar16 != iVar8.i; ppQVar16 = ppQVar16 + 1) {
              pQVar4 = *ppQVar16;
              iVar18 = ((pQVar4->d_ptr).d)->globalStackingOrder;
              if (iVar18 < (((*iVar7.i)->d_ptr).d)->globalStackingOrder) {
                pQVar13 = *iVar12.i;
                iVar15.i = ppQVar16;
                if (((pQVar13->d_ptr).d)->globalStackingOrder <= iVar18) {
                  do {
                    *iVar15.i = pQVar13;
                    pQVar13 = iVar15.i[-2];
                    iVar15.i = iVar15.i + -1;
                  } while (((pQVar13->d_ptr).d)->globalStackingOrder <=
                           ((pQVar4->d_ptr).d)->globalStackingOrder);
                }
              }
              else {
                lVar19 = (long)ppQVar16 - (long)iVar7.i >> 3;
                iVar15 = iVar7;
                if (0 < lVar19) {
                  lVar21 = 1;
                  do {
                    iVar12.i[lVar21] = iVar12.i[lVar21 + -1];
                    lVar2 = lVar19 + lVar21;
                    lVar21 = lVar21 + -1;
                  } while (1 < lVar2 - 1U);
                }
              }
              *iVar15.i = pQVar4;
              iVar12.i = iVar12.i + 1;
            }
          }
          else {
            sVar22 = 8;
            ppQVar14 = ppQVar16;
            do {
              ppQVar10 = iVar7.i + sVar22;
              pQVar4 = *(QGraphicsItem **)((long)iVar7.i + sVar22);
              iVar18 = ((pQVar4->d_ptr).d)->globalStackingOrder;
              if (iVar18 < (((*iVar7.i)->d_ptr).d)->globalStackingOrder) {
                pQVar13 = *iVar12.i;
                ppQVar11 = ppQVar14;
                iVar12.i = ppQVar10;
                if (((pQVar13->d_ptr).d)->globalStackingOrder <= iVar18) {
                  do {
                    *ppQVar11 = pQVar13;
                    pQVar13 = ppQVar11[-2];
                    iVar12.i = ppQVar11 + -1;
                    ppQVar11 = iVar12.i;
                  } while (((pQVar13->d_ptr).d)->globalStackingOrder <=
                           ((pQVar4->d_ptr).d)->globalStackingOrder);
                }
              }
              else {
                memmove(ppQVar16,iVar7.i,sVar22);
                iVar12 = iVar7;
              }
              *iVar12.i = pQVar4;
              sVar22 = sVar22 + 8;
              ppQVar14 = ppQVar14 + 1;
              iVar12.i = ppQVar10;
            } while (sVar22 != 0x80);
            for (ppQVar16 = iVar7.i + 0x10; ppQVar16 != iVar8.i; ppQVar16 = ppQVar16 + 1) {
              pQVar13 = ppQVar16[-1];
              pQVar4 = *ppQVar16;
              ppQVar14 = ppQVar16;
              if (((pQVar13->d_ptr).d)->globalStackingOrder <=
                  ((pQVar4->d_ptr).d)->globalStackingOrder) {
                do {
                  *ppQVar14 = pQVar13;
                  pQVar13 = ppQVar14[-2];
                  ppQVar14 = ppQVar14 + -1;
                } while (((pQVar13->d_ptr).d)->globalStackingOrder <=
                         ((pQVar4->d_ptr).d)->globalStackingOrder);
              }
              *ppQVar14 = pQVar4;
            }
          }
        }
      }
      else if (order == DescendingOrder) {
        iVar7 = QList<QGraphicsItem_*>::begin(itemList);
        iVar8 = QList<QGraphicsItem_*>::end(itemList);
        if (iVar7.i != iVar8.i) {
          uVar9 = (long)iVar8.i - (long)iVar7.i >> 3;
          lVar19 = 0x3f;
          if (uVar9 != 0) {
            for (; uVar9 >> lVar19 == 0; lVar19 = lVar19 + -1) {
            }
          }
          std::
          __introsort_loop<QList<QGraphicsItem*>::iterator,long_long,__gnu_cxx::__ops::_Iter_comp_iter<bool(*)(QGraphicsItem_const*,QGraphicsItem_const*)>>
                    (iVar7,iVar8,(ulong)(((uint)lVar19 ^ 0x3f) * 2) ^ 0x7e,
                     (_Iter_comp_iter<bool_(*)(const_QGraphicsItem_*,_const_QGraphicsItem_*)>)
                     0x6255ea);
          ppQVar16 = iVar7.i + 1;
          iVar12 = iVar7;
          if ((long)iVar8.i - (long)iVar7.i < 0x81) {
            for (; ppQVar16 != iVar8.i; ppQVar16 = ppQVar16 + 1) {
              pQVar4 = *ppQVar16;
              iVar18 = ((pQVar4->d_ptr).d)->globalStackingOrder;
              if (iVar18 < (((*iVar7.i)->d_ptr).d)->globalStackingOrder) {
                lVar19 = (long)ppQVar16 - (long)iVar7.i >> 3;
                iVar15 = iVar7;
                if (0 < lVar19) {
                  lVar21 = 1;
                  do {
                    iVar12.i[lVar21] = iVar12.i[lVar21 + -1];
                    lVar2 = lVar19 + lVar21;
                    lVar21 = lVar21 + -1;
                  } while (1 < lVar2 - 1U);
                }
              }
              else {
                pQVar13 = *iVar12.i;
                iVar15.i = ppQVar16;
                ppQVar14 = ppQVar16;
                if (iVar18 < ((pQVar13->d_ptr).d)->globalStackingOrder) {
                  do {
                    *ppQVar14 = pQVar13;
                    pQVar13 = ppQVar14[-2];
                    iVar15.i = ppQVar14 + -1;
                    ppQVar14 = ppQVar14 + -1;
                  } while (((pQVar4->d_ptr).d)->globalStackingOrder <
                           ((pQVar13->d_ptr).d)->globalStackingOrder);
                }
              }
              *iVar15.i = pQVar4;
              iVar12.i = iVar12.i + 1;
            }
          }
          else {
            sVar22 = 8;
            ppQVar14 = ppQVar16;
            do {
              ppQVar10 = iVar7.i + sVar22;
              pQVar4 = *(QGraphicsItem **)((long)iVar7.i + sVar22);
              iVar18 = ((pQVar4->d_ptr).d)->globalStackingOrder;
              if (iVar18 < (((*iVar7.i)->d_ptr).d)->globalStackingOrder) {
                memmove(ppQVar16,iVar7.i,sVar22);
                iVar12 = iVar7;
              }
              else {
                pQVar13 = *iVar12.i;
                iVar12.i = ppQVar10;
                ppQVar11 = ppQVar14;
                if (iVar18 < ((pQVar13->d_ptr).d)->globalStackingOrder) {
                  do {
                    *ppQVar11 = pQVar13;
                    pQVar13 = ppQVar11[-2];
                    iVar12.i = ppQVar11 + -1;
                    ppQVar11 = iVar12.i;
                  } while (((pQVar4->d_ptr).d)->globalStackingOrder <
                           ((pQVar13->d_ptr).d)->globalStackingOrder);
                }
              }
              *iVar12.i = pQVar4;
              sVar22 = sVar22 + 8;
              ppQVar14 = ppQVar14 + 1;
              iVar12.i = ppQVar10;
            } while (sVar22 != 0x80);
            for (ppQVar16 = iVar7.i + 0x10; ppQVar16 != iVar8.i; ppQVar16 = ppQVar16 + 1) {
              pQVar13 = ppQVar16[-1];
              pQVar4 = *ppQVar16;
              ppQVar14 = ppQVar16;
              if (((pQVar4->d_ptr).d)->globalStackingOrder <
                  ((pQVar13->d_ptr).d)->globalStackingOrder) {
                do {
                  *ppQVar14 = pQVar13;
                  pQVar13 = ppQVar14[-2];
                  ppQVar14 = ppQVar14 + -1;
                } while (((pQVar4->d_ptr).d)->globalStackingOrder <
                         ((pQVar13->d_ptr).d)->globalStackingOrder);
              }
              *ppQVar14 = pQVar4;
            }
          }
        }
      }
    }
    else if (order == AscendingOrder) {
      iVar7 = QList<QGraphicsItem_*>::begin(itemList);
      iVar8 = QList<QGraphicsItem_*>::end(itemList);
      if (iVar7.i != iVar8.i) {
        uVar9 = (long)iVar8.i - (long)iVar7.i >> 3;
        lVar19 = 0x3f;
        if (uVar9 != 0) {
          for (; uVar9 >> lVar19 == 0; lVar19 = lVar19 + -1) {
          }
        }
        std::
        __introsort_loop<QList<QGraphicsItem*>::iterator,long_long,__gnu_cxx::__ops::_Iter_comp_iter<bool(*)(QGraphicsItem_const*,QGraphicsItem_const*)>>
                  (iVar7,iVar8,(ulong)(((uint)lVar19 ^ 0x3f) * 2) ^ 0x7e,
                   (_Iter_comp_iter<bool_(*)(const_QGraphicsItem_*,_const_QGraphicsItem_*)>)0x625622
                  );
        ppQVar16 = iVar7.i + 1;
        iVar12 = iVar7;
        if ((long)iVar8.i - (long)iVar7.i < 0x81) {
          for (; ppQVar16 != iVar8.i; ppQVar16 = ppQVar16 + 1) {
            bVar6 = qt_closestItemFirst(*iVar7.i,*ppQVar16);
            pQVar4 = *ppQVar16;
            if (bVar6) {
              lVar19 = (long)ppQVar16 - (long)iVar7.i >> 3;
              iVar15 = iVar7;
              if (0 < lVar19) {
                lVar21 = 1;
                do {
                  iVar12.i[lVar21] = iVar12.i[lVar21 + -1];
                  lVar2 = lVar19 + lVar21;
                  lVar21 = lVar21 + -1;
                } while (1 < lVar2 - 1U);
              }
            }
            else {
              bVar6 = qt_closestItemFirst(*iVar12.i,pQVar4);
              ppQVar14 = ppQVar16;
              iVar15.i = ppQVar16;
              if (bVar6) {
                do {
                  iVar15.i = ppQVar14 + -1;
                  *ppQVar14 = ppQVar14[-1];
                  bVar6 = qt_closestItemFirst(ppQVar14[-2],pQVar4);
                  ppQVar14 = iVar15.i;
                } while (bVar6);
              }
            }
            *iVar15.i = pQVar4;
            iVar12.i = iVar12.i + 1;
          }
        }
        else {
          sVar22 = 8;
          ppQVar14 = ppQVar16;
          do {
            ppQVar10 = iVar7.i + sVar22;
            bVar6 = qt_closestItemFirst(*iVar7.i,*(QGraphicsItem **)((long)iVar7.i + sVar22));
            pQVar4 = *(QGraphicsItem **)((long)iVar7.i + sVar22);
            if (bVar6) {
              memmove(ppQVar16,iVar7.i,sVar22);
              iVar12 = iVar7;
            }
            else {
              bVar6 = qt_closestItemFirst(*iVar12.i,pQVar4);
              ppQVar11 = ppQVar14;
              iVar12.i = ppQVar10;
              if (bVar6) {
                do {
                  iVar12.i = ppQVar11 + -1;
                  *ppQVar11 = ppQVar11[-1];
                  bVar6 = qt_closestItemFirst(ppQVar11[-2],pQVar4);
                  ppQVar11 = iVar12.i;
                } while (bVar6);
              }
            }
            *iVar12.i = pQVar4;
            sVar22 = sVar22 + 8;
            ppQVar14 = ppQVar14 + 1;
            iVar12.i = ppQVar10;
          } while (sVar22 != 0x80);
          for (ppQVar16 = iVar7.i + 0x10; ppQVar16 != iVar8.i; ppQVar16 = ppQVar16 + 1) {
            pQVar4 = *ppQVar16;
            bVar6 = qt_closestItemFirst(ppQVar16[-1],pQVar4);
            ppQVar10 = ppQVar16;
            ppQVar14 = ppQVar16;
            if (bVar6) {
              do {
                ppQVar14 = ppQVar10 + -1;
                *ppQVar10 = ppQVar10[-1];
                bVar6 = qt_closestItemFirst(ppQVar10[-2],pQVar4);
                ppQVar10 = ppQVar14;
              } while (bVar6);
            }
            *ppQVar14 = pQVar4;
          }
        }
      }
    }
    else if (order == DescendingOrder) {
      iVar7 = QList<QGraphicsItem_*>::begin(itemList);
      iVar8 = QList<QGraphicsItem_*>::end(itemList);
      if (iVar7.i != iVar8.i) {
        uVar9 = (long)iVar8.i - (long)iVar7.i >> 3;
        lVar19 = 0x3f;
        if (uVar9 != 0) {
          for (; uVar9 >> lVar19 == 0; lVar19 = lVar19 + -1) {
          }
        }
        std::
        __introsort_loop<QList<QGraphicsItem*>::iterator,long_long,__gnu_cxx::__ops::_Iter_comp_iter<bool(*)(QGraphicsItem_const*,QGraphicsItem_const*)>>
                  (iVar7,iVar8,(ulong)(((uint)lVar19 ^ 0x3f) * 2) ^ 0x7e,
                   (_Iter_comp_iter<bool_(*)(const_QGraphicsItem_*,_const_QGraphicsItem_*)>)0x5ec7d9
                  );
        std::
        __final_insertion_sort<QList<QGraphicsItem*>::iterator,__gnu_cxx::__ops::_Iter_comp_iter<bool(*)(QGraphicsItem_const*,QGraphicsItem_const*)>>
                  (iVar7,iVar8,
                   (_Iter_comp_iter<bool_(*)(const_QGraphicsItem_*,_const_QGraphicsItem_*)>)0x5ec7d9
                  );
        return;
      }
    }
  }
  return;
LAB_00624c8c:
  ppQVar14 = ppQVar14 + -1;
LAB_00624c90:
  *ppQVar14 = pQVar4;
  ppQVar16 = ppQVar16 + 1;
  goto LAB_00624bb8;
LAB_00624a14:
  ppQVar14 = ppQVar14 + -1;
LAB_00624a18:
  *ppQVar14 = pQVar4;
  ppQVar16 = ppQVar16 + 1;
  goto LAB_00624940;
}

Assistant:

void QGraphicsSceneBspTreeIndexPrivate::sortItems(QList<QGraphicsItem *> *itemList, Qt::SortOrder order,
                                                  bool sortCacheEnabled, bool onlyTopLevelItems)
{
    if (order == Qt::SortOrder(-1))
        return;

    if (onlyTopLevelItems) {
        if (order == Qt::DescendingOrder)
            std::sort(itemList->begin(), itemList->end(), qt_closestLeaf);
        else if (order == Qt::AscendingOrder)
            std::sort(itemList->begin(), itemList->end(), qt_notclosestLeaf);
        return;
    }

    if (sortCacheEnabled) {
        if (order == Qt::DescendingOrder) {
            std::sort(itemList->begin(), itemList->end(), closestItemFirst_withCache);
        } else if (order == Qt::AscendingOrder) {
            std::sort(itemList->begin(), itemList->end(), closestItemLast_withCache);
        }
    } else {
        if (order == Qt::DescendingOrder) {
            std::sort(itemList->begin(), itemList->end(), qt_closestItemFirst);
        } else if (order == Qt::AscendingOrder) {
            std::sort(itemList->begin(), itemList->end(), qt_closestItemLast);
        }
    }
}